

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

bool Js::JavascriptRegExp::IsRegExpLike(Var aValue,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  ScriptConfiguration *this;
  RecyclableObject *instance;
  Var instance_00;
  Var symbolMatchProperty;
  ScriptContext *scriptContext_local;
  Var aValue_local;
  
  this = ScriptContext::GetConfig(scriptContext);
  bVar1 = ScriptConfiguration::IsES6RegExSymbolsEnabled(this);
  if (bVar1) {
    BVar2 = Js::JavascriptOperators::IsObject(aValue);
    if (BVar2 == 0) {
      return false;
    }
    instance = VarTo<Js::RecyclableObject>(aValue);
    instance_00 = Js::JavascriptOperators::GetProperty
                            (instance,0x15,scriptContext,(PropertyValueInfo *)0x0);
    BVar2 = Js::JavascriptOperators::IsUndefined(instance_00);
    if (BVar2 == 0) {
      bVar1 = JavascriptConversion::ToBool(instance_00,scriptContext);
      return bVar1;
    }
  }
  bVar1 = VarIs<Js::JavascriptRegExp>(aValue);
  return bVar1;
}

Assistant:

bool JavascriptRegExp::IsRegExpLike(Var aValue, ScriptContext* scriptContext)
    {
        if (scriptContext->GetConfig()->IsES6RegExSymbolsEnabled())
        {
            if (!JavascriptOperators::IsObject(aValue))
            {
                return false;
            }

            Var symbolMatchProperty = JavascriptOperators::GetProperty(
                VarTo<RecyclableObject>(aValue),
                PropertyIds::_symbolMatch,
                scriptContext);
            if (!JavascriptOperators::IsUndefined(symbolMatchProperty))
            {
                return JavascriptConversion::ToBool(symbolMatchProperty, scriptContext);
            }
        }

        return VarIs<JavascriptRegExp>(aValue);
    }